

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O0

String * kj::_::anon_unknown_2::makeDescriptionImpl
                   (String *__return_storage_ptr__,DescriptionStyle style,char *code,int errorNumber
                   ,char *sysErrorString,char *macroArgs,ArrayPtr<kj::String> argValues)

{
  int iVar1;
  kj *this;
  size_t sVar2;
  ArrayPtr<const_char> *pAVar3;
  char *pcVar4;
  ExceptionCallback *pEVar5;
  size_t sVar6;
  size_t sVar7;
  String *pSVar8;
  char *pcVar9;
  size_t size;
  ArrayPtr<kj::ArrayPtr<const_char>_> AVar10;
  ArrayPtr<const_char> AVar11;
  char *in_stack_fffffffffffffaf8;
  ArrayPtr<const_char> *local_328;
  size_t local_320;
  size_t i_1;
  char *pos_1;
  size_t local_308;
  size_t i;
  size_t totalSize;
  char *local_2f0;
  StringPtr local_2e8;
  char local_2d8 [8];
  char buffer [256];
  undefined1 local_1d0 [8];
  StringPtr sysErrorArray;
  StringPtr colon;
  StringPtr delim;
  StringPtr sep;
  StringPtr codeArray;
  StringPtr expected;
  char *equalsPos;
  size_t local_160;
  String local_158;
  ArrayPtr<const_char> local_140;
  ArrayPtr<const_char> local_130;
  char local_11e;
  byte local_11d;
  int local_11c;
  char c;
  bool quoted;
  char *pcStack_118;
  uint depth;
  char *pos;
  char *start;
  size_t index;
  undefined1 local_f0 [8];
  ArrayPtr<kj::ArrayPtr<const_char>_> argNames;
  Array<kj::ArrayPtr<const_char>_> argNames_heap;
  ArrayPtr<const_char> argNames_stack [8];
  bool argNames_isOnStack;
  size_t argNames_size;
  char *macroArgs_local;
  char *sysErrorString_local;
  char *pcStack_20;
  int errorNumber_local;
  char *code_local;
  String *pSStack_10;
  DescriptionStyle style_local;
  String *result;
  
  argNames_size = (size_t)macroArgs;
  macroArgs_local = sysErrorString;
  sysErrorString_local._4_4_ = errorNumber;
  pcStack_20 = code;
  code_local._4_4_ = style;
  pSStack_10 = __return_storage_ptr__;
  this = (kj *)ArrayPtr<kj::String>::size(&argValues);
  argNames_stack[7].size_._7_1_ = this < (kj *)0x9;
  local_328 = (ArrayPtr<const_char> *)&argNames_heap.disposer;
  do {
    ArrayPtr<const_char>::ArrayPtr(local_328);
    local_328 = local_328 + 1;
  } while (local_328 != (ArrayPtr<const_char> *)&argNames_stack[7].size_);
  if ((argNames_stack[7].size_._7_1_ & 1) == 0) {
    heapArray<kj::ArrayPtr<char_const>>
              ((Array<kj::ArrayPtr<const_char>_> *)&argNames.size_,this,size);
  }
  else {
    Array<kj::ArrayPtr<const_char>_>::Array
              ((Array<kj::ArrayPtr<const_char>_> *)&argNames.size_,(void *)0x0);
  }
  if ((argNames_stack[7].size_._7_1_ & 1) == 0) {
    AVar10 = kj::Array::operator_cast_to_ArrayPtr((Array *)&argNames.size_);
  }
  else {
    AVar10 = arrayPtr<kj::ArrayPtr<char_const>>
                       ((ArrayPtr<const_char> *)&argNames_heap.disposer,(size_t)this);
  }
  argNames.ptr = (ArrayPtr<const_char> *)AVar10.size_;
  local_f0 = (undefined1  [8])AVar10.ptr;
  sVar2 = ArrayPtr<kj::String>::size(&argValues);
  if (sVar2 != 0) {
    start = (char *)0x0;
    pos = (char *)argNames_size;
    while( true ) {
      iVar1 = isspace((int)*pos);
      if (iVar1 == 0) break;
      pos = pos + 1;
    }
    pcStack_118 = pos;
    local_11c = 0;
    local_11d = 0;
    while( true ) {
      pcVar4 = start;
      pcVar9 = pcStack_118 + 1;
      local_11e = *pcStack_118;
      if (local_11e == '\0') break;
      if ((local_11d & 1) == 0) {
        if (local_11e == '(') {
          local_11c = local_11c + 1;
          pcStack_118 = pcVar9;
        }
        else if (local_11e == ')') {
          local_11c = local_11c + -1;
          pcStack_118 = pcVar9;
        }
        else if (local_11e == '\"') {
          local_11d = 1;
          pcStack_118 = pcVar9;
        }
        else {
          pcStack_118 = pcVar9;
          if ((local_11e == ',') && (local_11c == 0)) {
            pcVar9 = (char *)ArrayPtr<kj::String>::size(&argValues);
            if (pcVar4 < pcVar9) {
              AVar11 = arrayPtr<char_const>(pos,pcStack_118 + -1);
              local_130 = AVar11;
              pAVar3 = ArrayPtr<kj::ArrayPtr<const_char>_>::operator[]
                                 ((ArrayPtr<kj::ArrayPtr<const_char>_> *)local_f0,(size_t)start);
              *pAVar3 = local_130;
            }
            start = start + 1;
            while( true ) {
              iVar1 = isspace((int)*pcStack_118);
              if (iVar1 == 0) break;
              pcStack_118 = pcStack_118 + 1;
            }
            pos = pcStack_118;
          }
        }
      }
      else if ((local_11e == '\\') && (*pcVar9 != '\0')) {
        pcStack_118 = pcStack_118 + 2;
      }
      else {
        pcStack_118 = pcVar9;
        if (local_11e == '\"') {
          local_11d = 0;
        }
      }
    }
    pcStack_118 = pcVar9;
    pcVar9 = (char *)ArrayPtr<kj::String>::size(&argValues);
    if (pcVar4 < pcVar9) {
      local_140 = arrayPtr<char_const>(pos,pcStack_118 + -1);
      pAVar3 = ArrayPtr<kj::ArrayPtr<const_char>_>::operator[]
                         ((ArrayPtr<kj::ArrayPtr<const_char>_> *)local_f0,(size_t)start);
      *pAVar3 = local_140;
    }
    pcVar4 = start + 1;
    start = pcVar4;
    pcVar9 = (char *)ArrayPtr<kj::String>::size(&argValues);
    if (pcVar4 != pcVar9) {
      pEVar5 = getExceptionCallback();
      local_160 = ArrayPtr<kj::String>::size(&argValues);
      equalsPos._7_1_ = 10;
      str<char_const(&)[41],unsigned_long,char_const(&)[9],char_const*&,char>
                (&local_158,(kj *)"Failed to parse logging macro args into ",
                 (char (*) [41])&local_160,(unsigned_long *)" names: ",(char (*) [9])&argNames_size,
                 (char **)((long)&equalsPos + 7),in_stack_fffffffffffffaf8);
      (*pEVar5->_vptr_ExceptionCallback[4])
                (pEVar5,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug.c++"
                 ,0xd9,0,&local_158);
      String::~String(&local_158);
    }
  }
  if (code_local._4_4_ == SYSCALL) {
    pcVar4 = strchr(pcStack_20,0x3d);
    if ((pcVar4 != (char *)0x0) && (pcVar4[1] != '=')) {
      do {
        pcStack_20 = pcVar4 + 1;
        iVar1 = isspace((int)*pcStack_20);
        pcVar4 = pcStack_20;
      } while (iVar1 != 0);
    }
  }
  if ((code_local._4_4_ == ASSERTION) && (pcStack_20 == (char *)0x0)) {
    code_local._4_4_ = LOG;
  }
  StringPtr::StringPtr((StringPtr *)&codeArray.content.size_,"expected ");
  if (code_local._4_4_ == LOG) {
    StringPtr::StringPtr((StringPtr *)&sep.content.size_,(void *)0x0);
  }
  else {
    StringPtr::StringPtr((StringPtr *)&sep.content.size_,pcStack_20);
  }
  StringPtr::StringPtr((StringPtr *)&delim.content.size_," = ");
  StringPtr::StringPtr((StringPtr *)&colon.content.size_,"; ");
  StringPtr::StringPtr((StringPtr *)&sysErrorArray.content.size_,": ");
  StringPtr::StringPtr((StringPtr *)local_1d0);
  if (code_local._4_4_ == SYSCALL) {
    if (macroArgs_local == (char *)0x0) {
      pcVar4 = strerror_r(sysErrorString_local._4_4_,local_2d8,0x100);
      StringPtr::StringPtr(&local_2e8,pcVar4);
      local_1d0 = (undefined1  [8])local_2e8.content.ptr;
      sysErrorArray.content.ptr = (char *)local_2e8.content.size_;
    }
    else {
      StringPtr::StringPtr((StringPtr *)&totalSize,macroArgs_local);
      local_1d0 = (undefined1  [8])totalSize;
      sysErrorArray.content.ptr = local_2f0;
    }
  }
  i = 0;
  if (code_local._4_4_ != LOG) {
    if (code_local._4_4_ == ASSERTION) {
      sVar2 = StringPtr::size((StringPtr *)&codeArray.content.size_);
      sVar7 = StringPtr::size((StringPtr *)&sep.content.size_);
      i = sVar2 + sVar7;
    }
    else if (code_local._4_4_ == SYSCALL) {
      sVar2 = StringPtr::size((StringPtr *)&sep.content.size_);
      sVar7 = StringPtr::size((StringPtr *)&sysErrorArray.content.size_);
      sVar6 = StringPtr::size((StringPtr *)local_1d0);
      i = sVar2 + sVar7 + sVar6;
    }
  }
  local_308 = 0;
  while( true ) {
    sVar2 = ArrayPtr<kj::String>::size(&argValues);
    if (sVar2 <= local_308) break;
    if ((local_308 != 0) || (code_local._4_4_ != LOG)) {
      sVar2 = StringPtr::size((StringPtr *)&colon.content.size_);
      i = sVar2 + i;
    }
    pAVar3 = ArrayPtr<kj::ArrayPtr<const_char>_>::operator[]
                       ((ArrayPtr<kj::ArrayPtr<const_char>_> *)local_f0,local_308);
    sVar2 = ArrayPtr<const_char>::size(pAVar3);
    if (sVar2 != 0) {
      pAVar3 = ArrayPtr<kj::ArrayPtr<const_char>_>::operator[]
                         ((ArrayPtr<kj::ArrayPtr<const_char>_> *)local_f0,local_308);
      pcVar4 = ArrayPtr<const_char>::operator[](pAVar3,0);
      if (*pcVar4 != '\"') {
        pAVar3 = ArrayPtr<kj::ArrayPtr<const_char>_>::operator[]
                           ((ArrayPtr<kj::ArrayPtr<const_char>_> *)local_f0,local_308);
        sVar2 = ArrayPtr<const_char>::size(pAVar3);
        sVar7 = StringPtr::size((StringPtr *)&delim.content.size_);
        i = sVar2 + sVar7 + i;
      }
    }
    pSVar8 = ArrayPtr<kj::String>::operator[](&argValues,local_308);
    sVar2 = String::size(pSVar8);
    i = sVar2 + i;
    local_308 = local_308 + 1;
  }
  heapString(__return_storage_ptr__,i);
  i_1 = (size_t)String::begin(__return_storage_ptr__);
  if (code_local._4_4_ != LOG) {
    if (code_local._4_4_ == ASSERTION) {
      i_1 = (size_t)fill<kj::StringPtr,kj::StringPtr&>
                              ((char *)i_1,(StringPtr *)&codeArray.content.size_,
                               (StringPtr *)&sep.content.size_);
    }
    else if (code_local._4_4_ == SYSCALL) {
      i_1 = (size_t)fill<kj::StringPtr,kj::StringPtr&,kj::StringPtr&>
                              ((char *)i_1,(StringPtr *)&sep.content.size_,
                               (StringPtr *)&sysErrorArray.content.size_,(StringPtr *)local_1d0);
    }
  }
  local_320 = 0;
  while( true ) {
    sVar2 = ArrayPtr<kj::String>::size(&argValues);
    if (sVar2 <= local_320) break;
    if ((local_320 != 0) || (code_local._4_4_ != LOG)) {
      i_1 = (size_t)fill<kj::StringPtr>((char *)i_1,(StringPtr *)&colon.content.size_);
    }
    pAVar3 = ArrayPtr<kj::ArrayPtr<const_char>_>::operator[]
                       ((ArrayPtr<kj::ArrayPtr<const_char>_> *)local_f0,local_320);
    sVar2 = ArrayPtr<const_char>::size(pAVar3);
    if (sVar2 != 0) {
      pAVar3 = ArrayPtr<kj::ArrayPtr<const_char>_>::operator[]
                         ((ArrayPtr<kj::ArrayPtr<const_char>_> *)local_f0,local_320);
      pcVar4 = ArrayPtr<const_char>::operator[](pAVar3,0);
      if (*pcVar4 != '\"') {
        pAVar3 = ArrayPtr<kj::ArrayPtr<const_char>_>::operator[]
                           ((ArrayPtr<kj::ArrayPtr<const_char>_> *)local_f0,local_320);
        i_1 = (size_t)fill<kj::ArrayPtr<char_const>,kj::StringPtr&>
                                ((char *)i_1,pAVar3,(StringPtr *)&delim.content.size_);
      }
    }
    pSVar8 = ArrayPtr<kj::String>::operator[](&argValues,local_320);
    i_1 = (size_t)fill<kj::String>((char *)i_1,pSVar8);
    local_320 = local_320 + 1;
  }
  Array<kj::ArrayPtr<const_char>_>::~Array((Array<kj::ArrayPtr<const_char>_> *)&argNames.size_);
  return __return_storage_ptr__;
}

Assistant:

static String makeDescriptionImpl(DescriptionStyle style, const char* code, int errorNumber,
                                  const char* sysErrorString, const char* macroArgs,
                                  ArrayPtr<String> argValues) {
  KJ_STACK_ARRAY(ArrayPtr<const char>, argNames, argValues.size(), 8, 64);

  if (argValues.size() > 0) {
    size_t index = 0;
    const char* start = macroArgs;
    while (isspace(*start)) ++start;
    const char* pos = start;
    uint depth = 0;
    bool quoted = false;
    while (char c = *pos++) {
      if (quoted) {
        if (c == '\\' && *pos != '\0') {
          ++pos;
        } else if (c == '\"') {
          quoted = false;
        }
      } else {
        if (c == '(') {
          ++depth;
        } else if (c == ')') {
          --depth;
        } else if (c == '\"') {
          quoted = true;
        } else if (c == ',' && depth == 0) {
          if (index < argValues.size()) {
            argNames[index] = arrayPtr(start, pos - 1);
          }
          ++index;
          while (isspace(*pos)) ++pos;
          start = pos;
        }
      }
    }
    if (index < argValues.size()) {
      argNames[index] = arrayPtr(start, pos - 1);
    }
    ++index;

    if (index != argValues.size()) {
      getExceptionCallback().logMessage(LogSeverity::ERROR, __FILE__, __LINE__, 0,
          str("Failed to parse logging macro args into ",
              argValues.size(), " names: ", macroArgs, '\n'));
    }
  }

  if (style == SYSCALL) {
    // Strip off leading "foo = " from code, since callers will sometimes write things like:
    //   ssize_t n;
    //   RECOVERABLE_SYSCALL(n = read(fd, buffer, sizeof(buffer))) { return ""; }
    //   return std::string(buffer, n);
    const char* equalsPos = strchr(code, '=');
    if (equalsPos != nullptr && equalsPos[1] != '=') {
      code = equalsPos + 1;
      while (isspace(*code)) ++code;
    }
  }

  if (style == ASSERTION && code == nullptr) {
    style = LOG;
  }

  {
    StringPtr expected = "expected ";
    StringPtr codeArray = style == LOG ? nullptr : StringPtr(code);
    StringPtr sep = " = ";
    StringPtr delim = "; ";
    StringPtr colon = ": ";

    StringPtr sysErrorArray;
// On android before marshmallow only the posix version of stderror_r was
// available, even with __USE_GNU.
#if __USE_GNU && !(defined(__ANDROID_API__) && __ANDROID_API__ < 23)
    char buffer[256];
    if (style == SYSCALL) {
      if (sysErrorString == nullptr) {
        sysErrorArray = strerror_r(errorNumber, buffer, sizeof(buffer));
      } else {
        sysErrorArray = sysErrorString;
      }
    }
#else
    char buffer[256];
    if (style == SYSCALL) {
      if (sysErrorString == nullptr) {
        strerror_r(errorNumber, buffer, sizeof(buffer));
        sysErrorArray = buffer;
      } else {
        sysErrorArray = sysErrorString;
      }
    }
#endif

    size_t totalSize = 0;
    switch (style) {
      case LOG:
        break;
      case ASSERTION:
        totalSize += expected.size() + codeArray.size();
        break;
      case SYSCALL:
        totalSize += codeArray.size() + colon.size() + sysErrorArray.size();
        break;
    }

    for (size_t i = 0; i < argValues.size(); i++) {
      if (i > 0 || style != LOG) {
        totalSize += delim.size();
      }
      if (argNames[i].size() > 0 && argNames[i][0] != '\"') {
        totalSize += argNames[i].size() + sep.size();
      }
      totalSize += argValues[i].size();
    }

    String result = heapString(totalSize);
    char* pos = result.begin();

    switch (style) {
      case LOG:
        break;
      case ASSERTION:
        pos = _::fill(pos, expected, codeArray);
        break;
      case SYSCALL:
        pos = _::fill(pos, codeArray, colon, sysErrorArray);
        break;
    }

    for (size_t i = 0; i < argValues.size(); i++) {
      if (i > 0 || style != LOG) {
        pos = _::fill(pos, delim);
      }
      if (argNames[i].size() > 0 && argNames[i][0] != '\"') {
        pos = _::fill(pos, argNames[i], sep);
      }
      pos = _::fill(pos, argValues[i]);
    }

    return result;
  }
}